

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_projection.cpp
# Opt level: O1

unique_ptr<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>,_true> __thiscall
duckdb::PhysicalProjection::CreateJoinProjection
          (PhysicalProjection *this,vector<duckdb::LogicalType,_true> *proj_types,
          vector<duckdb::LogicalType,_true> *lhs_types,vector<duckdb::LogicalType,_true> *rhs_types,
          vector<unsigned_long,_true> *left_projection_map,
          vector<unsigned_long,_true> *right_projection_map,idx_t estimated_cardinality)

{
  size_type *psVar1;
  __uniq_ptr_impl<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_> _Var2;
  const_reference pvVar3;
  BoundReferenceExpression *pBVar4;
  PhysicalProjection *this_00;
  long lVar5;
  size_type *psVar6;
  size_type sVar7;
  const_iterator __begin2;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  proj_selects;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_a8;
  vector<duckdb::LogicalType,_true> *local_90;
  pointer local_88;
  pointer puStack_80;
  pointer local_78;
  pointer local_68;
  element_type *peStack_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __uniq_ptr_impl<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_> local_48
  ;
  vector<duckdb::LogicalType,_true> *local_40;
  vector<unsigned_long,_true> *local_38;
  
  local_88 = (pointer)0x0;
  puStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  local_90 = rhs_types;
  local_48._M_t.
  super__Tuple_impl<0UL,_duckdb::PhysicalOperator_*,_std::default_delete<duckdb::PhysicalOperator>_>
  .super__Head_base<0UL,_duckdb::PhysicalOperator_*,_false>._M_head_impl =
       (tuple<duckdb::PhysicalOperator_*,_std::default_delete<duckdb::PhysicalOperator>_>)
       (tuple<duckdb::PhysicalOperator_*,_std::default_delete<duckdb::PhysicalOperator>_>)this;
  local_40 = proj_types;
  local_38 = right_projection_map;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::reserve((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_88,
            ((long)(proj_types->
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(proj_types->
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  psVar6 = (left_projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar1 = (left_projection_map->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar6 == psVar1) {
    if ((lhs_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (lhs_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start) {
      sVar7 = 0;
      do {
        pvVar3 = vector<duckdb::LogicalType,_true>::operator[](lhs_types,sVar7);
        pBVar4 = (BoundReferenceExpression *)operator_new(0x60);
        LogicalType::LogicalType((LogicalType *)&local_68,pvVar3);
        BoundReferenceExpression::BoundReferenceExpression(pBVar4,(LogicalType *)&local_68,sVar7);
        local_a8.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar4;
        LogicalType::~LogicalType((LogicalType *)&local_68);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_88,
                   (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                    *)&local_a8);
        if ((BoundReferenceExpression *)
            local_a8.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (BoundReferenceExpression *)0x0) {
          (*(((Expression *)
             &(local_a8.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)->
            super_BaseExpression)._vptr_BaseExpression[1])();
        }
        sVar7 = sVar7 + 1;
      } while (sVar7 < (ulong)(((long)(lhs_types->
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ).
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(lhs_types->
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ).
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555));
    }
  }
  else {
    do {
      sVar7 = *psVar6;
      pvVar3 = vector<duckdb::LogicalType,_true>::operator[](lhs_types,sVar7);
      pBVar4 = (BoundReferenceExpression *)operator_new(0x60);
      LogicalType::LogicalType((LogicalType *)&local_68,pvVar3);
      BoundReferenceExpression::BoundReferenceExpression(pBVar4,(LogicalType *)&local_68,sVar7);
      local_a8.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar4;
      LogicalType::~LogicalType((LogicalType *)&local_68);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_88,
                 (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                  *)&local_a8);
      if ((BoundReferenceExpression *)
          local_a8.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (BoundReferenceExpression *)0x0) {
        (*(((Expression *)
           &(local_a8.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)->
          super_BaseExpression)._vptr_BaseExpression[1])();
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar1);
  }
  lVar5 = ((long)(lhs_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                 ).super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(lhs_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                 ).super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  psVar6 = (local_38->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  psVar1 = (local_38->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (psVar6 == psVar1) {
    if ((local_90->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (local_90->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
        super__Vector_impl_data._M_start) {
      sVar7 = 0;
      do {
        pvVar3 = vector<duckdb::LogicalType,_true>::operator[](local_90,sVar7);
        pBVar4 = (BoundReferenceExpression *)operator_new(0x60);
        LogicalType::LogicalType((LogicalType *)&local_68,pvVar3);
        BoundReferenceExpression::BoundReferenceExpression
                  (pBVar4,(LogicalType *)&local_68,lVar5 + sVar7);
        local_a8.
        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar4;
        LogicalType::~LogicalType((LogicalType *)&local_68);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&local_88,
                   (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                    *)&local_a8);
        if ((BoundReferenceExpression *)
            local_a8.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (BoundReferenceExpression *)0x0) {
          (*(((Expression *)
             &(local_a8.
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)->
            super_BaseExpression)._vptr_BaseExpression[1])();
        }
        sVar7 = sVar7 + 1;
      } while (sVar7 < (ulong)(((long)(local_90->
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ).
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_90->
                                      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ).
                                      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              -0x5555555555555555));
    }
  }
  else {
    do {
      sVar7 = *psVar6;
      pvVar3 = vector<duckdb::LogicalType,_true>::operator[](local_90,sVar7);
      pBVar4 = (BoundReferenceExpression *)operator_new(0x60);
      LogicalType::LogicalType((LogicalType *)&local_68,pvVar3);
      BoundReferenceExpression::BoundReferenceExpression
                (pBVar4,(LogicalType *)&local_68,sVar7 + lVar5);
      local_a8.
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar4;
      LogicalType::~LogicalType((LogicalType *)&local_68);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<duckdb::BoundReferenceExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_88,
                 (unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                  *)&local_a8);
      if ((BoundReferenceExpression *)
          local_a8.
          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (BoundReferenceExpression *)0x0) {
        (*(((Expression *)
           &(local_a8.
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)->
          super_BaseExpression)._vptr_BaseExpression[1])();
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar1);
  }
  this_00 = (PhysicalProjection *)operator_new(0x98);
  local_68 = (local_40->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
  peStack_60 = (element_type *)
               (local_40->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish;
  local_58._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (local_40->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (local_40->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_40->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_40->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_88;
  local_a8.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = puStack_80;
  local_a8.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
  local_78 = (pointer)0x0;
  local_88 = (pointer)0x0;
  puStack_80 = (pointer)0x0;
  PhysicalProjection(this_00,(vector<duckdb::LogicalType,_true> *)&local_68,&local_a8,
                     estimated_cardinality);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
  _Var2._M_t.
  super__Tuple_impl<0UL,_duckdb::PhysicalOperator_*,_std::default_delete<duckdb::PhysicalOperator>_>
  .super__Head_base<0UL,_duckdb::PhysicalOperator_*,_false>._M_head_impl =
       local_48._M_t.
       super__Tuple_impl<0UL,_duckdb::PhysicalOperator_*,_std::default_delete<duckdb::PhysicalOperator>_>
       .super__Head_base<0UL,_duckdb::PhysicalOperator_*,_false>._M_head_impl;
  *(PhysicalProjection **)
   local_48._M_t.
   super__Tuple_impl<0UL,_duckdb::PhysicalOperator_*,_std::default_delete<duckdb::PhysicalOperator>_>
   .super__Head_base<0UL,_duckdb::PhysicalOperator_*,_false>._M_head_impl = this_00;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_88);
  return (unique_ptr<duckdb::PhysicalOperator,_std::default_delete<duckdb::PhysicalOperator>_>)
         (_Tuple_impl<0UL,_duckdb::PhysicalOperator_*,_std::default_delete<duckdb::PhysicalOperator>_>
          )_Var2._M_t.
           super__Tuple_impl<0UL,_duckdb::PhysicalOperator_*,_std::default_delete<duckdb::PhysicalOperator>_>
           .super__Head_base<0UL,_duckdb::PhysicalOperator_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<PhysicalOperator>
PhysicalProjection::CreateJoinProjection(vector<LogicalType> proj_types, const vector<LogicalType> &lhs_types,
                                         const vector<LogicalType> &rhs_types, const vector<idx_t> &left_projection_map,
                                         const vector<idx_t> &right_projection_map, const idx_t estimated_cardinality) {

	vector<unique_ptr<Expression>> proj_selects;
	proj_selects.reserve(proj_types.size());

	if (left_projection_map.empty()) {
		for (storage_t i = 0; i < lhs_types.size(); ++i) {
			proj_selects.emplace_back(make_uniq<BoundReferenceExpression>(lhs_types[i], i));
		}
	} else {
		for (auto i : left_projection_map) {
			proj_selects.emplace_back(make_uniq<BoundReferenceExpression>(lhs_types[i], i));
		}
	}
	const auto left_cols = lhs_types.size();

	if (right_projection_map.empty()) {
		for (storage_t i = 0; i < rhs_types.size(); ++i) {
			proj_selects.emplace_back(make_uniq<BoundReferenceExpression>(rhs_types[i], left_cols + i));
		}

	} else {
		for (auto i : right_projection_map) {
			proj_selects.emplace_back(make_uniq<BoundReferenceExpression>(rhs_types[i], left_cols + i));
		}
	}

	return make_uniq<PhysicalProjection>(std::move(proj_types), std::move(proj_selects), estimated_cardinality);
}